

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# midimapper.cpp
# Opt level: O2

string * __thiscall
rtosc::MidiMappernRT::getMappedString
          (string *__return_storage_ptr__,MidiMappernRT *this,string *addr)

{
  bool bVar1;
  int iVar2;
  mapped_type *pmVar3;
  ostream *this_00;
  stringstream out;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>
  local_1e0;
  stringstream local_1b8 [16];
  ostream local_1a8 [376];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  bVar1 = has_t<std::map<std::__cxx11::string,std::tuple<int,int,int,rtosc::MidiBijection>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::tuple<int,int,int,rtosc::MidiBijection>>>>,std::__cxx11::string>
                    (&this->inv_map,addr);
  if (bVar1) {
    pmVar3 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::tuple<int,_int,_int,_rtosc::MidiBijection>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::tuple<int,_int,_int,_rtosc::MidiBijection>_>_>_>
             ::operator[](&this->inv_map,addr);
    if ((pmVar3->super__Tuple_impl<0UL,_int,_int,_int,_rtosc::MidiBijection>).
        super__Tuple_impl<1UL,_int,_int,_rtosc::MidiBijection>.super__Head_base<1UL,_int,_false>.
        _M_head_impl != -1) {
      pmVar3 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::tuple<int,_int,_int,_rtosc::MidiBijection>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::tuple<int,_int,_int,_rtosc::MidiBijection>_>_>_>
               ::operator[](&this->inv_map,addr);
      std::ostream::operator<<
                (local_1a8,
                 (pmVar3->super__Tuple_impl<0UL,_int,_int,_int,_rtosc::MidiBijection>).
                 super__Tuple_impl<1UL,_int,_int,_rtosc::MidiBijection>.
                 super__Head_base<1UL,_int,_false>._M_head_impl);
    }
  }
  else {
    std::__cxx11::string::string((string *)&local_1e0,(string *)addr);
    local_1e0.second = true;
    bVar1 = has2<std::deque<std::pair<std::__cxx11::string,bool>,std::allocator<std::pair<std::__cxx11::string,bool>>>,std::pair<std::__cxx11::string,bool>>
                      (&this->learnQueue,&local_1e0);
    std::__cxx11::string::~string((string *)&local_1e0);
    if (bVar1) {
      std::__cxx11::string::string((string *)&local_1e0,(string *)addr);
      local_1e0.second = true;
      iVar2 = getInd<std::deque<std::pair<std::__cxx11::string,bool>,std::allocator<std::pair<std::__cxx11::string,bool>>>,std::pair<std::__cxx11::string,bool>>
                        (&this->learnQueue,&local_1e0);
      std::ostream::operator<<(local_1a8,iVar2);
      std::__cxx11::string::~string((string *)&local_1e0);
    }
  }
  bVar1 = has_t<std::map<std::__cxx11::string,std::tuple<int,int,int,rtosc::MidiBijection>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::tuple<int,int,int,rtosc::MidiBijection>>>>,std::__cxx11::string>
                    (&this->inv_map,addr);
  if (bVar1) {
    pmVar3 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::tuple<int,_int,_int,_rtosc::MidiBijection>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::tuple<int,_int,_int,_rtosc::MidiBijection>_>_>_>
             ::operator[](&this->inv_map,addr);
    if ((pmVar3->super__Tuple_impl<0UL,_int,_int,_int,_rtosc::MidiBijection>).
        super__Tuple_impl<1UL,_int,_int,_rtosc::MidiBijection>.
        super__Tuple_impl<2UL,_int,_rtosc::MidiBijection>.super__Head_base<2UL,_int,_false>.
        _M_head_impl != -1) {
      this_00 = std::operator<<((ostream *)local_1a8,":");
      pmVar3 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::tuple<int,_int,_int,_rtosc::MidiBijection>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::tuple<int,_int,_int,_rtosc::MidiBijection>_>_>_>
               ::operator[](&this->inv_map,addr);
      std::ostream::operator<<
                ((ostream *)this_00,
                 (pmVar3->super__Tuple_impl<0UL,_int,_int,_int,_rtosc::MidiBijection>).
                 super__Tuple_impl<1UL,_int,_int,_rtosc::MidiBijection>.
                 super__Tuple_impl<2UL,_int,_rtosc::MidiBijection>.super__Head_base<2UL,_int,_false>
                 ._M_head_impl);
    }
  }
  else {
    std::__cxx11::string::string((string *)&local_1e0,(string *)addr);
    local_1e0.second = false;
    bVar1 = has2<std::deque<std::pair<std::__cxx11::string,bool>,std::allocator<std::pair<std::__cxx11::string,bool>>>,std::pair<std::__cxx11::string,bool>>
                      (&this->learnQueue,&local_1e0);
    std::__cxx11::string::~string((string *)&local_1e0);
    if (bVar1) {
      std::__cxx11::string::string((string *)&local_1e0,(string *)addr);
      local_1e0.second = false;
      iVar2 = getInd<std::deque<std::pair<std::__cxx11::string,bool>,std::allocator<std::pair<std::__cxx11::string,bool>>>,std::pair<std::__cxx11::string,bool>>
                        (&this->learnQueue,&local_1e0);
      std::ostream::operator<<(local_1a8,iVar2);
      std::__cxx11::string::~string((string *)&local_1e0);
    }
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  return __return_storage_ptr__;
}

Assistant:

std::string MidiMappernRT::getMappedString(std::string addr)
{
    std::stringstream out;
    //find coarse
    if(has_t(inv_map,addr)) {
        if(std::get<1>(inv_map[addr]) != -1)
            out << std::get<1>(inv_map[addr]);
    }else if(has2(learnQueue, make_pair(addr,true)))
        out << getInd(learnQueue,std::make_pair(addr,true));
    //find Fine
    if(has_t(inv_map,addr)) {
        if(std::get<2>(inv_map[addr]) != -1)
            out << ":" << std::get<2>(inv_map[addr]);
    } else if(has2(learnQueue, make_pair(addr,false)))
        out << getInd(learnQueue,std::make_pair(addr,false));

    return out.str();
}